

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O1

void ge25519_nielsadd2(ge25519 *r,ge25519_niels *q)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  ulong uVar382;
  ulong uVar383;
  ulong uVar384;
  ulong uVar385;
  ulong uVar386;
  ulong uVar387;
  ulong uVar388;
  ulong uVar389;
  ulong uVar390;
  long lVar391;
  ulong uVar392;
  ulong uVar393;
  ulong uVar394;
  long lVar395;
  ulong uVar396;
  ulong uVar397;
  ulong uVar398;
  ulong uVar399;
  ulong uVar400;
  ulong uVar401;
  ulong uVar402;
  ulong uVar403;
  ulong uVar404;
  ulong uVar405;
  ulong uVar406;
  ulong uVar407;
  ulong uVar408;
  ulong uVar409;
  ulong uVar410;
  ulong uVar411;
  ulong uVar412;
  ulong uVar413;
  
  uVar388 = (r->y[0] + 0xfffffffffffda) - r->x[0];
  uVar404 = (r->y[1] + 0xffffffffffffe) - r->x[1];
  uVar407 = r->x[0] + r->y[0];
  uVar397 = r->x[1] + r->y[1];
  uVar408 = q->ysubx[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar408;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar388;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar408;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar404;
  uVar399 = (r->y[2] + 0xffffffffffffe) - r->x[2];
  uVar383 = (r->y[3] + 0xffffffffffffe) - r->x[3];
  uVar400 = q->ysubx[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar400;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar388;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar408;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar399;
  uVar405 = q->ysubx[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar405;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar388;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar400;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar404;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar408;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar383;
  uVar393 = r->x[2] + r->y[2];
  uVar403 = q->ysubx[3];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar403;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar388;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar400;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar399;
  uVar384 = r->x[3] + r->y[3];
  uVar396 = (r->y[4] + 0xffffffffffffe) - r->x[4];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar405;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar404;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar408;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar396;
  uVar413 = q->ysubx[4] * 0x13;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = q->ysubx[4];
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar388;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar403;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar404;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar400;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar383;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar405;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar399;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar413;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar404;
  uVar403 = uVar403 * 0x13;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar400 * 0x13;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar396;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar405 * 0x13;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar383;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar403;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar399;
  uVar408 = r->x[4] + r->y[4];
  auVar4 = auVar22 * auVar197 + auVar21 * auVar196 + auVar20 * auVar195 + auVar4 * auVar179 +
           auVar19 * auVar194;
  uVar400 = auVar4._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar413;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar399;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar405 * 0x13;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar396;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar403;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar383;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar413;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar383;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar403;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar396;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar413;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar396;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = auVar4._8_8_ * 0x2000 | uVar400 >> 0x33;
  auVar357 = auVar25 * auVar200 + auVar24 * auVar199 + auVar5 * auVar180 + auVar6 * auVar181 +
             auVar23 * auVar198 + auVar357;
  uVar396 = auVar357._0_8_;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = auVar357._8_8_ * 0x2000 | uVar396 >> 0x33;
  auVar358 = auVar26 * auVar201 +
             auVar8 * auVar183 + auVar7 * auVar182 + auVar9 * auVar184 + auVar27 * auVar202 +
             auVar358;
  uVar399 = auVar358._0_8_;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = auVar358._8_8_ * 0x2000 | uVar399 >> 0x33;
  uVar399 = uVar399 & 0x7ffffffffffff;
  auVar354 = auVar28 * auVar203 +
             auVar11 * auVar186 + auVar13 * auVar188 + auVar10 * auVar185 + auVar12 * auVar187 +
             auVar354;
  uVar385 = auVar354._0_8_;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = auVar354._8_8_ << 0xd | uVar385 >> 0x33;
  uVar385 = uVar385 & 0x7ffffffffffff;
  auVar359 = auVar18 * auVar193 + auVar14 * auVar189 + auVar17 * auVar192 + auVar16 * auVar191 +
             auVar15 * auVar190 + auVar359;
  uVar383 = auVar359._0_8_;
  uVar388 = (auVar359._8_8_ * 0x2000 | uVar383 >> 0x33) * 0x13 + (uVar400 & 0x7ffffffffffff);
  uVar400 = q->xaddy[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar400;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar407;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar400;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar397;
  uVar405 = q->xaddy[1];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar405;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar407;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar400;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar393;
  uVar403 = q->xaddy[2];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar403;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar407;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar405;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar397;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar400;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar384;
  uVar413 = q->xaddy[3];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar413;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar407;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar405;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar393;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar403;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar397;
  lVar395 = (uVar388 >> 0x33) + (uVar396 & 0x7ffffffffffff);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar400;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar408;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = q->xaddy[4];
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar407;
  uVar400 = uVar413 * 0x13;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar413;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar397;
  uVar413 = q->xaddy[4] * 0x13;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar405;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar384;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar403;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar393;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar413;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar397;
  uVar383 = uVar383 & 0x7ffffffffffff;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar405 * 0x13;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar408;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar403 * 0x13;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar384;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar400;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar393;
  uVar388 = uVar388 & 0x7ffffffffffff;
  auVar4 = auVar44 * auVar219 +
           auVar47 * auVar222 + auVar46 * auVar221 + auVar45 * auVar220 + auVar29 * auVar204;
  uVar405 = auVar4._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar413;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar393;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar403 * 0x13;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar408;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar400;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar384;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar413;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar384;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar400;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar408;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar413;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar408;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = auVar4._8_8_ * 0x2000 | uVar405 >> 0x33;
  auVar360 = auVar48 * auVar223 +
             auVar50 * auVar225 + auVar49 * auVar224 + auVar30 * auVar205 + auVar31 * auVar206 +
             auVar360;
  uVar408 = auVar360._0_8_;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = auVar360._8_8_ * 0x2000 | uVar408 >> 0x33;
  auVar361 = auVar51 * auVar226 +
             auVar52 * auVar227 + auVar33 * auVar208 + auVar32 * auVar207 + auVar34 * auVar209 +
             auVar361;
  uVar389 = auVar361._0_8_;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = auVar361._8_8_ * 0x2000 | uVar389 >> 0x33;
  uVar389 = uVar389 & 0x7ffffffffffff;
  auVar355 = auVar53 * auVar228 +
             auVar36 * auVar211 + auVar38 * auVar213 + auVar35 * auVar210 + auVar37 * auVar212 +
             auVar355;
  uVar390 = auVar355._0_8_;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = auVar355._8_8_ << 0xd | uVar390 >> 0x33;
  uVar390 = uVar390 & 0x7ffffffffffff;
  auVar362 = auVar40 * auVar215 +
             auVar41 * auVar216 + auVar43 * auVar218 + auVar39 * auVar214 + auVar42 * auVar217 +
             auVar362;
  uVar404 = auVar362._0_8_;
  uVar382 = (auVar362._8_8_ * 0x2000 | uVar404 >> 0x33) * 0x13 + (uVar405 & 0x7ffffffffffff);
  lVar391 = (uVar382 >> 0x33) + (uVar408 & 0x7ffffffffffff);
  uVar382 = uVar382 & 0x7ffffffffffff;
  uVar384 = q->t2d[0];
  uVar393 = r->t[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar393;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar384;
  uVar408 = uVar382 + uVar388;
  uVar396 = r->t[1];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar396;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar384;
  uVar400 = lVar391 + lVar395;
  uVar407 = q->t2d[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar393;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar407;
  uVar405 = uVar389 + uVar399;
  uVar387 = r->t[2];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar387;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar384;
  uVar403 = uVar390 + uVar385;
  uVar1 = q->t2d[2];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar393;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar1;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar396;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar407;
  uVar404 = uVar404 & 0x7ffffffffffff;
  uVar2 = r->t[3];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar2;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar384;
  uVar413 = uVar404 + uVar383;
  uVar397 = q->t2d[3];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar393;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar397;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar387;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar407;
  uVar409 = (lVar391 - lVar395) + 0xffffffffffffe;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar396;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar1;
  uVar3 = r->t[4];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar3;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar384;
  uVar384 = q->t2d[4] * 0x13;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar393;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = q->t2d[4];
  uVar399 = (uVar389 - uVar399) + 0xffffffffffffe;
  uVar393 = uVar397 * 0x13;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar396;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar397;
  uVar397 = (uVar390 - uVar385) + 0xffffffffffffe;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar2;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar407;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar387;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar1;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar396;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar384;
  uVar404 = (uVar404 - uVar383) + 0xffffffffffffe;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar3;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar407 * 0x13;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar2;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar1 * 0x13;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar387;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar393;
  auVar4 = auVar72 * auVar247 + auVar69 * auVar244 + auVar54 * auVar229 + auVar71 * auVar246 +
           auVar70 * auVar245;
  uVar383 = auVar4._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar387;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar384;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar3;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar1 * 0x13;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar2;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar393;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar2;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar384;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar3;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar393;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar3;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar384;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = auVar4._8_8_ * 0x2000 | uVar383 >> 0x33;
  auVar363 = auVar74 * auVar249 +
             auVar75 * auVar250 + auVar73 * auVar248 + auVar55 * auVar230 + auVar56 * auVar231 +
             auVar363;
  uVar407 = auVar363._0_8_;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = auVar363._8_8_ * 0x2000 | uVar407 >> 0x33;
  auVar364 = auVar57 * auVar232 + auVar58 * auVar233 + auVar59 * auVar234 + auVar76 * auVar251 +
             auVar77 * auVar252 + auVar364;
  uVar384 = auVar364._0_8_;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = auVar364._8_8_ * 0x2000 | uVar384 >> 0x33;
  uVar384 = uVar384 & 0x7ffffffffffff;
  auVar356 = auVar78 * auVar253 +
             auVar60 * auVar235 + auVar62 * auVar237 + auVar61 * auVar236 + auVar63 * auVar238 +
             auVar356;
  uVar393 = auVar356._0_8_;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = auVar356._8_8_ << 0xd | uVar393 >> 0x33;
  uVar393 = uVar393 & 0x7ffffffffffff;
  uVar386 = (uVar382 - uVar388) + 0xfffffffffffda;
  auVar365 = auVar64 * auVar239 +
             auVar67 * auVar242 + auVar68 * auVar243 + auVar65 * auVar240 + auVar66 * auVar241 +
             auVar365;
  uVar396 = auVar365._0_8_;
  uVar383 = (auVar365._8_8_ * 0x2000 | uVar396 >> 0x33) * 0x13 + (uVar383 & 0x7ffffffffffff);
  lVar391 = (uVar383 >> 0x33) + (uVar407 & 0x7ffffffffffff);
  uVar383 = uVar383 & 0x7ffffffffffff;
  uVar385 = (r->z[0] * 2 - uVar383) + 0x1fffffffffffb4;
  uVar398 = (r->z[1] * 2 + 0x1ffffffffffffc) - lVar391;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar385;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar386;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar385;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar409;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar398;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar386;
  uVar396 = uVar396 & 0x7ffffffffffff;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar385;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar399;
  uVar411 = (r->z[2] * 2 + 0x1ffffffffffffc) - uVar384;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar411;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar386;
  uVar401 = (r->z[3] * 2 + 0x1ffffffffffffc) - uVar393;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar398;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar409;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar385;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar397;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar401;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar386;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar398;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar399;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar409;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar411;
  uVar389 = (r->z[4] * 2 + 0x1ffffffffffffc) - uVar396;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar385;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar404;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar389;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar386;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar401;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar409;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar398;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar397;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar411;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar399;
  uVar1 = uVar411 * 0x13;
  uVar2 = uVar389 * 0x13;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar2;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar409;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar398 * 0x13;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar404;
  uVar3 = uVar401 * 0x13;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar1;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar397;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar3;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar399;
  auVar4 = auVar95 * auVar270 +
           auVar94 * auVar269 + auVar97 * auVar272 + auVar96 * auVar271 + auVar79 * auVar254;
  uVar407 = auVar4._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar2;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar399;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar1;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar404;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar3;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar397;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar2;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar397;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar3;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar404;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar2;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar404;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = auVar4._8_8_ << 0xd | uVar407 >> 0x33;
  auVar366 = auVar98 * auVar273 + auVar99 * auVar274 + auVar100 * auVar275 + auVar80 * auVar255 +
             auVar81 * auVar256 + auVar366;
  uVar410 = auVar366._0_8_;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = auVar366._8_8_ * 0x2000 | uVar410 >> 0x33;
  auVar367 = auVar102 * auVar277 + auVar83 * auVar258 + auVar101 * auVar276 + auVar82 * auVar257 +
             auVar84 * auVar259 + auVar367;
  uVar394 = auVar367._0_8_;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = auVar367._8_8_ * 0x2000 | uVar394 >> 0x33;
  uVar383 = uVar383 + r->z[0] * 2;
  auVar368 = auVar103 * auVar278 + auVar86 * auVar261 + auVar88 * auVar263 + auVar85 * auVar260 +
             auVar87 * auVar262 + auVar368;
  uVar390 = auVar368._0_8_;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = auVar368._8_8_ * 0x2000 | uVar390 >> 0x33;
  uVar388 = lVar391 + r->z[1] * 2;
  uVar384 = uVar384 + r->z[2] * 2;
  uVar393 = uVar393 + r->z[3] * 2;
  uVar396 = uVar396 + r->z[4] * 2;
  auVar380 = auVar92 * auVar267 +
             auVar89 * auVar264 + auVar90 * auVar265 + auVar91 * auVar266 + auVar93 * auVar268 +
             auVar380;
  uVar382 = auVar380._0_8_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar383;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar408;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar383;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar400;
  uVar392 = (auVar380._8_8_ * 0x2000 | uVar382 >> 0x33) * 0x13 + (uVar407 & 0x7ffffffffffff);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar388;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar408;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar383;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar405;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar384;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar408;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar388;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar400;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar383;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar403;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar393;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar408;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar388;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar405;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar400;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar384;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar383;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar413;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar396;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar408;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar393;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar400;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar388;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar403;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar384;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar405;
  uVar407 = uVar396 * 0x13;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar407;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar400;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar388 * 0x13;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar413;
  uVar387 = uVar393 * 0x13;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar384 * 0x13;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar403;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar387;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar405;
  auVar4 = auVar120 * auVar295 +
           auVar119 * auVar294 + auVar122 * auVar297 + auVar121 * auVar296 + auVar104 * auVar279;
  uVar412 = auVar4._0_8_;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar407;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar405;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar384 * 0x13;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar413;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar387;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar403;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar407;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar403;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar387;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar413;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar407;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar413;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = auVar4._8_8_ * 0x2000 | uVar412 >> 0x33;
  auVar369 = auVar123 * auVar298 + auVar125 * auVar300 + auVar124 * auVar299 + auVar105 * auVar280 +
             auVar106 * auVar281 + auVar369;
  uVar387 = auVar369._0_8_;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = auVar369._8_8_ * 0x2000 | uVar387 >> 0x33;
  auVar370 = auVar127 * auVar302 + auVar108 * auVar283 + auVar126 * auVar301 + auVar107 * auVar282 +
             auVar109 * auVar284 + auVar370;
  uVar402 = auVar370._0_8_;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = auVar370._8_8_ * 0x2000 | uVar402 >> 0x33;
  auVar371 = auVar110 * auVar285 + auVar128 * auVar303 + auVar111 * auVar286 + auVar113 * auVar288 +
             auVar112 * auVar287 + auVar371;
  uVar407 = auVar371._0_8_;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = auVar371._8_8_ * 0x2000 | uVar407 >> 0x33;
  auVar372 = auVar114 * auVar289 + auVar115 * auVar290 + auVar116 * auVar291 + auVar118 * auVar293 +
             auVar117 * auVar292 + auVar372;
  uVar406 = auVar372._0_8_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar385;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar383;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar388;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uVar385;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar398;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar383;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar385;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar384;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar383;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar411;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar398;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar388;
  uVar412 = (auVar372._8_8_ * 0x2000 | uVar406 >> 0x33) * 0x13 + (uVar412 & 0x7ffffffffffff);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar385;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar393;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar383;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar401;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar398;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar384;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar388;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar411;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar385;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar396;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar383;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar389;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar388;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar401;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar398;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar393;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar411;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar384;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar388;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar2;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar398 * 0x13;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar396;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar393;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar1;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar3;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar384;
  auVar4 = auVar145 * auVar320 +
           auVar144 * auVar319 + auVar147 * auVar322 + auVar146 * auVar321 + auVar129 * auVar304;
  uVar385 = auVar4._0_8_;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar2;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar384;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar396;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar1;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar3;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar393;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar2;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar393;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar396;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar3;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar2;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar396;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = auVar4._8_8_ << 0xd | uVar385 >> 0x33;
  auVar373 = auVar131 * auVar306 + auVar148 * auVar323 + auVar150 * auVar325 + auVar149 * auVar324 +
             auVar130 * auVar305 + auVar373;
  uVar384 = auVar373._0_8_;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = auVar373._8_8_ * 0x2000 | uVar384 >> 0x33;
  auVar374 = auVar132 * auVar307 + auVar151 * auVar326 + auVar152 * auVar327 + auVar133 * auVar308 +
             auVar134 * auVar309 + auVar374;
  uVar396 = auVar374._0_8_;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = auVar374._8_8_ * 0x2000 | uVar396 >> 0x33;
  auVar375 = auVar135 * auVar310 + auVar153 * auVar328 + auVar136 * auVar311 + auVar137 * auVar312 +
             auVar138 * auVar313 + auVar375;
  uVar383 = auVar375._0_8_;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = auVar375._8_8_ * 0x2000 | uVar383 >> 0x33;
  auVar381 = auVar142 * auVar317 +
             auVar141 * auVar316 + auVar139 * auVar314 + auVar140 * auVar315 + auVar143 * auVar318 +
             auVar381;
  uVar388 = auVar381._0_8_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar408;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar386;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar409;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar408;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar400;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar386;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar408;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar399;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar386;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar405;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar400;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar409;
  uVar393 = (auVar381._8_8_ * 0x2000 | uVar388 >> 0x33) * 0x13 + (uVar385 & 0x7ffffffffffff);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar408;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar397;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar386;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar403;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar400;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar399;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar409;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar405;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar408;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar404;
  uVar408 = uVar413 * 0x13;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar386;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar413;
  uVar413 = uVar403 * 0x13;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar409;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar403;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar400;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar397;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar405;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar399;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar409;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar408;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar400 * 0x13;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar404;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar397;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar405 * 0x13;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar413;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar399;
  auVar4 = auVar170 * auVar345 +
           auVar169 * auVar344 + auVar172 * auVar347 + auVar171 * auVar346 + auVar154 * auVar329;
  uVar400 = auVar4._0_8_;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar408;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar399;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar404;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar405 * 0x13;
  r->x[0] = uVar392 & 0x7ffffffffffff;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar413;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar397;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar408;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar397;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar404;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar413;
  r->x[1] = (uVar392 >> 0x33) + (uVar410 & 0x7ffffffffffff);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar408;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar404;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = auVar4._8_8_ << 0xd | uVar400 >> 0x33;
  r->x[2] = uVar394 & 0x7ffffffffffff;
  r->x[3] = uVar390 & 0x7ffffffffffff;
  auVar376 = auVar173 * auVar348 + auVar175 * auVar350 + auVar174 * auVar349 + auVar156 * auVar331 +
             auVar155 * auVar330 + auVar376;
  uVar413 = auVar376._0_8_;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = auVar376._8_8_ * 0x2000 | uVar413 >> 0x33;
  r->x[4] = uVar382 & 0x7ffffffffffff;
  r->y[0] = uVar412 & 0x7ffffffffffff;
  r->y[1] = (uVar412 >> 0x33) + (uVar387 & 0x7ffffffffffff);
  r->y[2] = uVar402 & 0x7ffffffffffff;
  auVar377 = auVar159 * auVar334 +
             auVar157 * auVar332 + auVar176 * auVar351 + auVar177 * auVar352 + auVar158 * auVar333 +
             auVar377;
  uVar405 = auVar377._0_8_;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = auVar377._8_8_ * 0x2000 | uVar405 >> 0x33;
  r->y[3] = uVar407 & 0x7ffffffffffff;
  r->y[4] = uVar406 & 0x7ffffffffffff;
  auVar378 = auVar178 * auVar353 + auVar161 * auVar336 + auVar160 * auVar335 + auVar162 * auVar337 +
             auVar163 * auVar338 + auVar378;
  uVar408 = auVar378._0_8_;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = auVar378._8_8_ * 0x2000 | uVar408 >> 0x33;
  r->z[0] = uVar393 & 0x7ffffffffffff;
  r->z[1] = (uVar393 >> 0x33) + (uVar384 & 0x7ffffffffffff);
  r->z[2] = uVar396 & 0x7ffffffffffff;
  r->z[3] = uVar383 & 0x7ffffffffffff;
  auVar379 = auVar166 * auVar341 + auVar168 * auVar343 + auVar165 * auVar340 + auVar164 * auVar339 +
             auVar167 * auVar342 + auVar379;
  uVar403 = auVar379._0_8_;
  r->z[4] = uVar388 & 0x7ffffffffffff;
  uVar400 = (auVar379._8_8_ * 0x2000 | uVar403 >> 0x33) * 0x13 + (uVar400 & 0x7ffffffffffff);
  r->t[0] = uVar400 & 0x7ffffffffffff;
  r->t[1] = (uVar400 >> 0x33) + (uVar413 & 0x7ffffffffffff);
  r->t[2] = uVar405 & 0x7ffffffffffff;
  r->t[3] = uVar408 & 0x7ffffffffffff;
  r->t[4] = uVar403 & 0x7ffffffffffff;
  return;
}

Assistant:

static void
ge25519_nielsadd2(ge25519 *r, const ge25519_niels *q) {
	bignum25519 a,b,c,e,f,g,h;

	curve25519_sub(a, r->y, r->x);
	curve25519_add(b, r->y, r->x);
	curve25519_mul(a, a, q->ysubx);
	curve25519_mul(e, b, q->xaddy);
	curve25519_add(h, e, a);
	curve25519_sub(e, e, a);
	curve25519_mul(c, r->t, q->t2d);
	curve25519_add(f, r->z, r->z);
	curve25519_add_after_basic(g, f, c);
	curve25519_sub_after_basic(f, f, c);
	curve25519_mul(r->x, e, f);
	curve25519_mul(r->y, h, g);
	curve25519_mul(r->z, g, f);
	curve25519_mul(r->t, e, h);
}